

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.h
# Opt level: O2

void __thiscall
enact::ForExpr::ForExpr
          (ForExpr *this,Token *name,
          unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *object,
          unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *body)

{
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__ForExpr_00124328;
  Token::Token(&this->name,name);
  (this->object)._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
  super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
  super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl =
       (object->_M_t).super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
       super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
       super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (object->_M_t).super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
  super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
  super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  (this->body)._M_t.super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>.
  _M_t.super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
  super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl =
       (body->_M_t).super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>.
       _M_t.super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
       super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl;
  (body->_M_t).super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>._M_t.
  super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
  super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl = (BlockExpr *)0x0;
  return;
}

Assistant:

ForExpr(Token name, std::unique_ptr<Expr> object, std::unique_ptr<BlockExpr> body) :
                name{std::move(name)},
                object{std::move(object)},
                body{std::move(body)} {}